

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::InstanceConfigRuleSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,InstanceConfigRuleSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *node;
  SyntaxNode *local_70;
  size_t index_local;
  InstanceConfigRuleSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->instance).kind;
    token._2_1_ = (this->instance).field_0x2;
    token.numFlags.raw = (this->instance).numFlags.raw;
    token.rawLen = (this->instance).rawLen;
    token.info = (this->instance).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->topModule).kind;
    token_00._2_1_ = (this->topModule).field_0x2;
    token_00.numFlags.raw = (this->topModule).numFlags.raw;
    token_00.rawLen = (this->topModule).rawLen;
    token_00.info = (this->topModule).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    local_70 = (SyntaxNode *)0x0;
    if (this != (InstanceConfigRuleSyntax *)0xffffffffffffffd0) {
      local_70 = &(this->instanceNames).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 3:
    node = &not_null<slang::syntax::ConfigRuleClauseSyntax_*>::get(&this->ruleClause)->
            super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 4:
    token_01.kind = (this->semi).kind;
    token_01._2_1_ = (this->semi).field_0x2;
    token_01.numFlags.raw = (this->semi).numFlags.raw;
    token_01.rawLen = (this->semi).rawLen;
    token_01.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax InstanceConfigRuleSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return instance;
        case 1: return topModule;
        case 2: return &instanceNames;
        case 3: return ruleClause.get();
        case 4: return semi;
        default: return nullptr;
    }
}